

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode
          (sysbvm_context_t *context,sysbvm_tuple_t node)

{
  uint32_t *puVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *psVar5;
  sysbvm_metatype_t *metatype;
  
  _Var2 = sysbvm_astNode_isLiteralNode(context,node);
  if (_Var2) {
    sVar3 = sysbvm_astLiteralNode_getValue(node);
    return sVar3;
  }
  if ((node & 0xf) == 0 && node != 0) {
    sVar3 = *(sysbvm_tuple_t *)(node + 0x20);
  }
  else {
    sVar3 = 0;
  }
  sVar4 = sysbvm_tuple_getType(context,sVar3);
  sVar4 = sysbvm_type_lookupSelector
                    (context,sVar4,
                     (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
  if (sVar4 != 0) {
LAB_0011fa39:
    sVar3 = sysbvm_function_apply2(context,sVar4,sVar3,node);
    return sVar3;
  }
  _Var2 = sysbvm_type_isReferenceType(sVar3);
  if (_Var2) {
    sVar3 = *(sysbvm_tuple_t *)(sVar3 + 0xf8);
    sVar4 = sysbvm_tuple_getType(context,sVar3);
    sVar4 = sysbvm_type_lookupSelector
                      (context,sVar4,
                       (context->roots).getOrCreateDependentApplicationValueForNodeSelector);
    if (sVar4 != 0) goto LAB_0011fa39;
  }
  _Var2 = sysbvm_tuple_isKindOf(context,sVar3,(context->roots).metatypeType);
  if ((!_Var2) ||
     (psVar5 = *(sysbvm_object_tuple_t **)(sVar3 + 0xf8), psVar5 == (sysbvm_object_tuple_t *)0x0)) {
    psVar5 = sysbvm_context_allocatePointerTuple(context,sVar3,0);
    if (((ulong)psVar5 & 0xf) == 0 && psVar5 != (sysbvm_object_tuple_t *)0x0) {
      puVar1 = &(psVar5->header).identityHashAndFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  return (sysbvm_tuple_t)psVar5;
}

Assistant:

static sysbvm_tuple_t sysbvm_dependentFunctionType_getOrCreateDependentApplicationValueForNode(sysbvm_context_t *context, sysbvm_tuple_t node)
{
    // Unwrap the literal values.
    if(sysbvm_astNode_isLiteralNode(context, node))
        return sysbvm_astLiteralNode_getValue(node);

    // Get the analyzed type of the node.
    sysbvm_tuple_t analyzedType = sysbvm_astNode_getAnalyzedType(node);

    // Find a method.
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
    if(method)
        return sysbvm_function_apply2(context, method, analyzedType, node);

    // Use the base type in the case of reference types.
    if(sysbvm_type_isReferenceType(analyzedType))
    {
        analyzedType = ((sysbvm_referenceType_t*)analyzedType)->super.baseType;
        sysbvm_tuple_t baseTypeMethod = sysbvm_type_lookupSelector(context, sysbvm_tuple_getType(context, analyzedType), context->roots.getOrCreateDependentApplicationValueForNodeSelector);
        if(baseTypeMethod)
            return sysbvm_function_apply2(context, baseTypeMethod, analyzedType, node);
    }

    // If the node is a subtype of metatype, and this type is defined then return the type.
    if(sysbvm_tuple_isKindOf(context, analyzedType, context->roots.metatypeType))
    {
        sysbvm_metatype_t *metatype = (sysbvm_metatype_t*)analyzedType;
        if(metatype->thisType)
            return metatype->thisType;
    }

    // Construct a dummy value that has the same type
    sysbvm_tuple_t dummyValue = (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, analyzedType, 0);
    sysbvm_tuple_markDummyValue(dummyValue);
    return dummyValue;
}